

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

UBool icu_63::util_equalRules(NFRule *rule1,NFRule *rule2)

{
  UBool UVar1;
  NFRule *rule2_local;
  NFRule *rule1_local;
  
  if (rule1 == (NFRule *)0x0) {
    if (rule2 == (NFRule *)0x0) {
      return '\x01';
    }
  }
  else if (rule2 != (NFRule *)0x0) {
    UVar1 = NFRule::operator==(rule1,rule2);
    return UVar1;
  }
  return '\0';
}

Assistant:

static UBool
util_equalRules(const NFRule* rule1, const NFRule* rule2)
{
    if (rule1) {
        if (rule2) {
            return *rule1 == *rule2;
        }
    } else if (!rule2) {
        return TRUE;
    }
    return FALSE;
}